

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledFont8x16.cxx
# Opt level: O3

OledPoint SSD1306::drawString8x16(OledPoint *p,char *string,PixelStyle style,OledPixel *oled)

{
  uint8_t c;
  OledPoint OVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  OledPoint local_38;
  
  OVar1 = *p;
  if (string == (char *)0x0) {
    return OVar1;
  }
  uVar4 = (ulong)OVar1 >> 0x20;
  uVar3 = (ulong)OVar1 & 0xffffffff;
  local_38 = OVar1;
  do {
    c = *string;
    if (c == '\n') {
      uVar2 = (int)uVar4 + 0x10;
      uVar4 = (ulong)uVar2;
      local_38.m_y = uVar2;
      local_38.m_x = OVar1.m_x;
      uVar3 = (ulong)OVar1 & 0xffffffff;
    }
    else {
      if (c == '\0') {
        return local_38;
      }
      drawChar8x16(&local_38,c,style,oled);
      uVar2 = (int)uVar3 + 8;
      uVar3 = (ulong)uVar2;
      local_38.m_x = uVar2;
    }
    string = (char *)((uint8_t *)string + 1);
  } while( true );
}

Assistant:

SSD1306::OledPoint
SSD1306::drawString8x16(
    const OledPoint& p,
    const char* string,
    PixelStyle style,
    OledPixel& oled)
{
    OledPoint position{p};

    if (string != nullptr)
    {
        OledPoint start{p};

        while (*string != '\0')
        {
            if (*string == '\n')
            {
                position.set(
                    start.x(),
                    position.y() + sc_fontHeight8x16);
            }
            else
            {
                drawChar8x16(position, *string, style, oled);

                position.set(
                    position.x() + sc_fontWidth8x16,
                    position.y());
            }
            ++string;
        }
    }

    return position;
}